

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Saig_ManDemiterSimpleDiff(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  int iVar1;
  Vec_Ptr_t *vSet;
  Vec_Ptr_t *vSet_00;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAVar2;
  char *pcVar3;
  int iVar4;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  
  iVar4 = 0;
  if ((p->nRegs & 1U) == 0 && p->nRegs != 0) {
    Saig_ManDemiterMarkPos(p);
    vSet = Vec_PtrAlloc(p->nTruePos);
    vSet_00 = Vec_PtrAlloc(p->nTruePos);
    for (iVar4 = 0; iVar4 < p->nTruePos; iVar4 = iVar4 + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar4);
      iVar1 = Saig_ManDemiterCheckPo(p,pObj,&pObj0,&pObj1);
      if (iVar1 == 0) {
        iVar4 = 0;
        goto LAB_0051efe1;
      }
      Vec_PtrPush(vSet,pObj0);
      Vec_PtrPush(vSet_00,pObj1);
    }
    pAVar2 = Aig_ManDupNodesHalf(p,vSet,0);
    *ppAig0 = pAVar2;
    if (pAVar2->pName != (char *)0x0) {
      free(pAVar2->pName);
      (*ppAig0)->pName = (char *)0x0;
    }
    pcVar3 = Abc_UtilStrsav("part0");
    (*ppAig0)->pName = pcVar3;
    iVar4 = 1;
    pAVar2 = Aig_ManDupNodesHalf(p,vSet_00,1);
    *ppAig1 = pAVar2;
    if (pAVar2->pName != (char *)0x0) {
      free(pAVar2->pName);
      (*ppAig1)->pName = (char *)0x0;
    }
    pcVar3 = Abc_UtilStrsav("part1");
    (*ppAig1)->pName = pcVar3;
LAB_0051efe1:
    Vec_PtrFree(vSet);
    Vec_PtrFree(vSet_00);
    Aig_ManCleanMarkAB(p);
  }
  return iVar4;
}

Assistant:

int Saig_ManDemiterSimpleDiff( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1;
    int i;
    if ( Aig_ManRegNum(p) == 0 || (Aig_ManRegNum(p) & 1) )
        return 0;
    Saig_ManDemiterMarkPos( p );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Saig_ManDemiterCheckPo( p, pObj, &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            Aig_ManCleanMarkAB( p );
            return 0;
        }
        Vec_PtrPush( vSet0, pObj0 );
        Vec_PtrPush( vSet1, pObj1 );
    }
    // create new AIG
    *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 );
    ABC_FREE( (*ppAig0)->pName );
    (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    // create new AIGs
    *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 );
    ABC_FREE( (*ppAig1)->pName );
    (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    // cleanup
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Aig_ManCleanMarkAB( p );
    return 1;
}